

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall
CVmObjVector::add_val(CVmObjVector *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  size_t __n;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  vm_obj_id_t vVar8;
  long lVar9;
  long *plVar10;
  bool bVar11;
  uint16_t tmp_1;
  vm_val_t ele;
  vm_val_t local_50;
  vm_val_t local_40;
  
  pvVar5 = sp_;
  uVar4 = *(undefined4 *)&val->field_0x4;
  aVar3 = val->val;
  sp_ = sp_ + 1;
  pvVar5->typ = val->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar3;
  uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  iVar6 = vm_val_t::is_listlike(val);
  if (iVar6 == 0) {
    vVar7 = 0xffffffff;
  }
  else {
    vVar7 = vm_val_t::ll_length(val);
  }
  vVar8 = 1;
  if (-1 < (int)vVar7) {
    vVar8 = vVar7;
  }
  vVar8 = create(0,(ulong)(vVar8 + uVar1));
  result->typ = VM_OBJ;
  (result->val).obj = vVar8;
  pvVar5 = sp_;
  pCVar2 = G_obj_table_X.pages_[vVar8 >> 0xc];
  uVar4 = *(undefined4 *)&result->field_0x4;
  aVar3 = result->val;
  sp_ = sp_ + 1;
  pvVar5->typ = result->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar3;
  plVar10 = (long *)((long)&pCVar2[vVar8 & 0xfff].ptr_ + 8);
  __n = (ulong)uVar1 * 5;
  memcpy((void *)(*plVar10 + 4),(this->super_CVmObjCollection).super_CVmObject.ext_ + 4,__n);
  *(ushort *)(*plVar10 + 2) = uVar1;
  if ((int)vVar7 < 0) {
    vmb_put_dh((char *)(*plVar10 + __n + 4),val);
    *(ushort *)(*plVar10 + 2) = uVar1 + 1;
  }
  else if (vVar7 != 0) {
    lVar9 = (ulong)uVar1 * 5 + 4;
    vVar8 = 1;
    do {
      local_50.typ = VM_INT;
      local_50.val.obj = vVar8;
      vm_val_t::ll_index(val,&local_40,&local_50);
      vmb_put_dh((char *)(*plVar10 + lVar9),&local_40);
      *(ushort *)(*plVar10 + 2) = uVar1 + (short)vVar8;
      lVar9 = lVar9 + 5;
      bVar11 = vVar8 != vVar7;
      vVar8 = vVar8 + 1;
    } while (bVar11);
  }
  sp_ = sp_ + -2;
  return 1;
}

Assistant:

int CVmObjVector::add_val(VMG_ vm_val_t *result,
                          vm_obj_id_t self, const vm_val_t *val)
{
    int idx;
    int rhs_cnt, alo_cnt;
    int i;
    CVmObjVector *new_vec;

    /* push the value to append, for gc protection */
    G_stk->push(val);

    /* 
     *   remember the index of the first new element - this is simply one
     *   higher than the last valid current index 
     */
    idx = get_element_count();

    /* get the number of elements to add */
    rhs_cnt = (val->is_listlike(vmg0_) ? val->ll_length(vmg0_) : -1);

    /* if it's not list-like, just add it directly as a single element */
    alo_cnt = (rhs_cnt < 0 ? 1 : rhs_cnt);

    /* 
     *   allocate a copy of the vector for the result - make it big enough
     *   for my elements plus the elements to be appended 
     */
    result->set_obj(create(vmg_ FALSE, idx + alo_cnt));

    /* get the return value as a vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ result->val.obj);

    /* push the result for gc protection */
    G_stk->push(result);

    /* copy my elements into the result */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(idx));

    /* 
     *   set the element count to include the elements copied so far (it's a
     *   new vector, so there's no need to save undo) 
     */
    new_vec->set_element_count(idx);

    /* add the new element or elements */
    if (rhs_cnt < 0)
    {
        /* add a single element */
        new_vec->set_element(idx, val);
        new_vec->set_element_count(idx + 1);
    }
    else
    {
        /* add the contents of the rhs */
        for (i = 1 ; i <= rhs_cnt ; ++i, ++idx)
        {
            /* get this element from the right-hand side */
            vm_val_t ele;
            val->ll_index(vmg_ &ele, i);
            
            /* store the element in the result */
            new_vec->set_element(idx, &ele);
            new_vec->set_element_count(idx + 1);
        }
    }

    /* discard the gc protect */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}